

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  reference repositoryName;
  ostream *poVar5;
  allocator local_5fa;
  allocator local_5f9;
  string local_5f8;
  undefined1 local_5d8 [8];
  string sysName;
  string local_5b0;
  char *local_590;
  char *optExeSuffix;
  undefined1 local_568 [8];
  ostringstream cmCPackLog_msg_1;
  allocator local_3e9;
  string local_3e8;
  char *local_3c8;
  char *cpackDownloadAll;
  string local_3b8;
  char *local_398;
  char *ifwDownloadAll;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_388;
  iterator rit;
  string local_378;
  undefined1 local_358 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RepoAllVector;
  string local_338;
  char *local_318;
  char *RepoAllStr;
  allocator local_301;
  string local_300;
  char *local_2e0;
  char *site;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  char *local_288;
  char *dirs;
  string local_278;
  char *local_258;
  char *FrameworkVersionSrt;
  char *RepoGenStr;
  string local_240 [32];
  undefined1 local_220 [8];
  ostringstream cmCPackLog_msg;
  char *BinCreatorStr;
  undefined1 local_98 [8];
  string FrameworkVersionOpt;
  undefined1 local_70 [8];
  string RepoGenOpt;
  allocator local_39;
  undefined1 local_38 [8];
  string BinCreatorOpt;
  cmCPackIFWGenerator *this_local;
  
  BinCreatorOpt.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"CPACK_IFW_BINARYCREATOR_EXECUTABLE",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_70,"CPACK_IFW_REPOGEN_EXECUTABLE",
             (allocator *)(FrameworkVersionOpt.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(FrameworkVersionOpt.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_98,"CPACK_IFW_FRAMEWORK_VERSION",
             (allocator *)((long)&BinCreatorStr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&BinCreatorStr + 7));
  bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_38);
  if (((!bVar2) ||
      (bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_70), !bVar2))
     || (bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)local_98), !bVar2))
  {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
  if ((pcVar3 == (char *)0x0) || (bVar2 = cmSystemTools::IsNOTFOUND(pcVar3), bVar2)) {
    std::__cxx11::string::operator=((string *)&this->BinCreator,"");
  }
  else {
    std::__cxx11::string::operator=((string *)&this->BinCreator,pcVar3);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    FrameworkVersionSrt =
         cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_70);
    if ((FrameworkVersionSrt == (char *)0x0) ||
       (bVar2 = cmSystemTools::IsNOTFOUND(FrameworkVersionSrt), bVar2)) {
      std::__cxx11::string::operator=((string *)&this->RepoGen,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->RepoGen,FrameworkVersionSrt);
    }
    local_258 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_98);
    if (local_258 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->FrameworkVersion,"1.9.9");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->FrameworkVersion,local_258);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_278,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES",
               (allocator *)((long)&dirs + 7));
    bVar2 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_278);
    this->ResolveDuplicateNames = bVar2;
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dirs + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->PkgsDirsVector);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"CPACK_IFW_PACKAGES_DIRECTORIES",&local_2a9);
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    local_288 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d0,pcVar3,(allocator *)((long)&site + 7));
      cmSystemTools::ExpandListArgument(&local_2d0,&this->PkgsDirsVector,false);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&site + 7));
    }
    (this->Installer).super_cmCPackIFWCommon.Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    (this->Repository).super_cmCPackIFWCommon.Generator = this;
    std::__cxx11::string::operator=((string *)&(this->Repository).Name,"Unspecified");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"CPACK_DOWNLOAD_SITE",&local_301);
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    local_2e0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&(this->Repository).Url,pcVar3);
      RepoAllStr = (char *)&this->Repository;
      std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::push_back
                (&(this->Installer).RemoteRepositories,(value_type *)&RepoAllStr);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_338,"CPACK_IFW_REPOSITORIES_ALL",
               (allocator *)
               ((long)&RepoAllVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&RepoAllVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_318 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_358);
      pcVar3 = local_318;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_378,pcVar3,(allocator *)((long)&rit._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_378,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_358,false);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)((long)&rit._M_current + 7));
      local_388._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_358);
      while( true ) {
        ifwDownloadAll =
             (char *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_358);
        bVar2 = __gnu_cxx::operator!=
                          (&local_388,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&ifwDownloadAll);
        if (!bVar2) break;
        repositoryName =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_388);
        GetRepository(this,repositoryName);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_388);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_358);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3b8,"CPACK_IFW_DOWNLOAD_ALL",
               (allocator *)((long)&cpackDownloadAll + 7));
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cpackDownloadAll + 7));
    local_398 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e8,"CPACK_DOWNLOAD_ALL",&local_3e9);
      pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      local_3c8 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        this->OnlineOnly = false;
      }
      else {
        bVar2 = cmSystemTools::IsOn(pcVar3);
        this->OnlineOnly = bVar2;
      }
    }
    else {
      bVar2 = cmSystemTools::IsOn(pcVar3);
      this->OnlineOnly = bVar2;
    }
    bVar2 = std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::empty
                      (&(this->Installer).RemoteRepositories);
    if ((bVar2) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5b0,"CMAKE_EXECUTABLE_SUFFIX",
                 (allocator *)(sysName.field_2._M_local_buf + 0xf));
      pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator((allocator<char> *)(sysName.field_2._M_local_buf + 0xf));
      local_590 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = cmCPackGenerator::GetOutputExtension(&this->super_cmCPackGenerator);
        std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,pcVar3);
      }
      else {
        std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,pcVar3);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_5f8,"CMAKE_SYSTEM_NAME",&local_5f9);
          pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_5f8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_5d8,pcVar3,&local_5fa);
          std::allocator<char>::~allocator((allocator<char> *)&local_5fa);
          std::__cxx11::string::~string((string *)&local_5f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_5d8,"Linux");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)&this->ExecutableSuffix,".run");
          }
          std::__cxx11::string::~string((string *)local_5d8);
        }
      }
      this_local._4_4_ = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
      poVar5 = std::operator<<((ostream *)local_568,
                               "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0x12f,pcVar3);
        std::__cxx11::string::~string((string *)&optExeSuffix);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_568);
      this_local._4_4_ = 0;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    poVar5 = std::operator<<((ostream *)local_220,
                             "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0xec,pcVar3);
      std::__cxx11::string::~string(local_240);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
    this_local._4_4_ = 0;
  }
  RepoGenStr._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";
  const std::string FrameworkVersionOpt = "CPACK_IFW_FRAMEWORK_VERSION";

  if (!this->IsSet(BinCreatorOpt) || !this->IsSet(RepoGenOpt) ||
      !this->IsSet(FrameworkVersionOpt)) {
    this->ReadListFile("CPackIFW.cmake");
  }

  // Look 'binarycreator' executable (needs)

  const char* BinCreatorStr = this->GetOption(BinCreatorOpt);
  if (!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr)) {
    this->BinCreator = "";
  } else {
    this->BinCreator = BinCreatorStr;
  }

  if (this->BinCreator.empty()) {
    cmCPackIFWLogger(ERROR, "Cannot find QtIFW compiler \"binarycreator\": "
                            "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Look 'repogen' executable (optional)

  const char* RepoGenStr = this->GetOption(RepoGenOpt);
  if (!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr)) {
    this->RepoGen = "";
  } else {
    this->RepoGen = RepoGenStr;
  }

  // Framework version
  if (const char* FrameworkVersionSrt = this->GetOption(FrameworkVersionOpt)) {
    this->FrameworkVersion = FrameworkVersionSrt;
  } else {
    this->FrameworkVersion = "1.9.9";
  }

  // Variables that Change Behavior

  // Resolve duplicate names
  this->ResolveDuplicateNames =
    this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  this->PkgsDirsVector.clear();
  if (const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->PkgsDirsVector);
  }

  // Installer
  this->Installer.Generator = this;
  this->Installer.ConfigureFromOptions();

  // Repository
  this->Repository.Generator = this;
  this->Repository.Name = "Unspecified";
  if (const char* site = this->GetOption("CPACK_DOWNLOAD_SITE")) {
    this->Repository.Url = site;
    this->Installer.RemoteRepositories.push_back(&this->Repository);
  }

  // Repositories
  if (const char* RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL")) {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr, RepoAllVector);
    for (std::vector<std::string>::iterator rit = RepoAllVector.begin();
         rit != RepoAllVector.end(); ++rit) {
      this->GetRepository(*rit);
    }
  }

  if (const char* ifwDownloadAll = this->GetOption("CPACK_IFW_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
  } else if (const char* cpackDownloadAll =
               this->GetOption("CPACK_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
  } else {
    this->OnlineOnly = false;
  }

  if (!this->Installer.RemoteRepositories.empty() && this->RepoGen.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW repository generator \"repogen\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Executable suffix
  if (const char* optExeSuffix = this->GetOption("CMAKE_EXECUTABLE_SUFFIX")) {
    this->ExecutableSuffix = optExeSuffix;
    if (this->ExecutableSuffix.empty()) {
      std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
      if (sysName == "Linux") {
        this->ExecutableSuffix = ".run";
      }
    }
  } else {
    this->ExecutableSuffix = this->cmCPackGenerator::GetOutputExtension();
  }

  return this->Superclass::InitializeInternal();
}